

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

void Url_Decode_UTF8(string *source)

{
  uchar uVar1;
  uchar uVar2;
  long lVar3;
  long lVar4;
  uchar k;
  char *point;
  int pos;
  int i;
  char tp [1000];
  string *source_local;
  
  point._0_4_ = 0;
  tp._992_8_ = source;
  memset(&pos,0,1000);
  lVar3 = std::__cxx11::string::c_str();
  point._4_4_ = 0;
  while( true ) {
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == point._4_4_) break;
    if (*(char *)(lVar3 + point._4_4_) == '%') {
      uVar1 = trans2bit(*(char *)(lVar3 + (point._4_4_ + 1)));
      uVar2 = trans2bit(*(char *)(lVar3 + (point._4_4_ + 2)));
      *(uchar *)((long)&pos + (long)(int)point) = uVar1 * '\x10' + uVar2;
      point._4_4_ = point._4_4_ + 3;
    }
    else {
      *(undefined1 *)((long)&pos + (long)(int)point) = *(undefined1 *)(lVar3 + point._4_4_);
      point._4_4_ = point._4_4_ + 1;
    }
    point._0_4_ = (int)point + 1;
  }
  std::__cxx11::string::operator=((string *)tp._992_8_,(char *)&pos);
  return;
}

Assistant:

void Url_Decode_UTF8(std::string &source)
{
  char tp[1000];
  int i,pos=0;
  memset(tp,0,1000);
  const char * point=source.c_str();
  for (i=0;source.size()-i;)
  {
    if (point[i]=='%')
    {
      unsigned char k=trans2bit(point[i+1])*16+trans2bit(point[i+2]);
      tp[pos++]=k;
      i+=3;
    }
    else 
     tp[pos++]= point[i++];
  }
  source=tp;
  //printf("Url_Decode_UTF8 : %s\n",source.c_str());
}